

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateRecorder::record_descriptor_set_layout
          (StateRecorder *this,VkDescriptorSetLayout set_layout,
          VkDescriptorSetLayoutCreateInfo *create_info,Hash custom_hash)

{
  Impl *this_00;
  bool bVar1;
  WorkItem local_68;
  uint local_44;
  VkDescriptorSetLayoutCreateInfo *local_40;
  VkDescriptorSetLayoutCreateInfo *new_info;
  lock_guard<std::mutex> lock;
  Hash custom_hash_local;
  VkDescriptorSetLayoutCreateInfo *create_info_local;
  VkDescriptorSetLayout set_layout_local;
  StateRecorder *this_local;
  
  lock._M_device = (mutex_type *)custom_hash;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&new_info,&this->impl->record_lock);
  local_40 = (VkDescriptorSetLayoutCreateInfo *)0x0;
  bVar1 = Impl::copy_descriptor_set_layout
                    (this->impl,create_info,&this->impl->temp_allocator,&local_40);
  if (bVar1) {
    this_00 = this->impl;
    local_68.type = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO;
    local_68.handle = api_object_cast<unsigned_long,VkDescriptorSetLayout_T*>(set_layout);
    local_68.create_info = local_40;
    local_68.custom_hash = (Hash)lock._M_device;
    Impl::push_work_locked(this_00,&local_68);
  }
  else {
    Impl::push_unregister_locked<VkDescriptorSetLayout_T*>
              (this->impl,VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO,set_layout);
    this_local._7_1_ = 0;
  }
  local_44 = (uint)!bVar1;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&new_info);
  if (local_44 == 0) {
    Impl::pump_synchronized_recording(this->impl,this);
    this_local._7_1_ = 1;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool StateRecorder::record_descriptor_set_layout(VkDescriptorSetLayout set_layout, const VkDescriptorSetLayoutCreateInfo &create_info,
                                                 Hash custom_hash)
{
	{
		std::lock_guard<std::mutex> lock(impl->record_lock);

		VkDescriptorSetLayoutCreateInfo *new_info = nullptr;
		if (!impl->copy_descriptor_set_layout(&create_info, impl->temp_allocator, &new_info))
		{
			// Have to forget any reference if this API handle is recycled.
			impl->push_unregister_locked(VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO, set_layout);
			return false;
		}

		impl->push_work_locked({VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO, api_object_cast<uint64_t>(set_layout),
		                        new_info, custom_hash});
	}

	impl->pump_synchronized_recording(this);
	return true;
}